

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.h
# Opt level: O2

bool uuids::uuid::is_valid_uuid<wchar_t[37]>(wchar_t (*in_str) [37])

{
  bool bVar1;
  size_t sVar2;
  wchar_t *pwVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  size_t i;
  ulong uVar7;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> bVar8;
  
  bVar8 = detail::to_string_view<wchar_t>(*in_str);
  pwVar3 = bVar8._M_str;
  sVar2 = bVar8._M_len;
  if ((sVar2 == 0) || ((*pwVar3 == L'{' && (pwVar3[sVar2 - 1] != L'}')))) {
    return false;
  }
  uVar7 = (ulong)(*pwVar3 == L'{');
  uVar4 = sVar2 - uVar7;
  bVar5 = 1;
  uVar6 = 0;
  do {
    if (uVar4 <= uVar7) {
      return 0xf < uVar6;
    }
    if (pwVar3[uVar7] != L'-') {
      if (0xf < uVar6) {
        return false;
      }
      bVar1 = detail::is_hex<wchar_t>(pwVar3[uVar7]);
      if (!bVar1) {
        return false;
      }
      bVar5 = ~bVar5 & 1;
      uVar6 = uVar6 + bVar5;
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

[[nodiscard]] constexpr static bool is_valid_uuid(StringType const & in_str) noexcept
      {
         auto str = detail::to_string_view(in_str);
         bool firstDigit = true;
         size_t hasBraces = 0;
         size_t index = 0;

         if (str.empty())
            return false;

         if (str.front() == '{')
            hasBraces = 1;
         if (hasBraces && str.back() != '}')
            return false;

         for (size_t i = hasBraces; i < str.size() - hasBraces; ++i)
         {
            if (str[i] == '-') continue;

            if (index >= 16 || !detail::is_hex(str[i]))
            {
               return false;
            }

            if (firstDigit)
            {
               firstDigit = false;
            }
            else
            {
               index++;
               firstDigit = true;
            }
         }

         if (index < 16)
         {
            return false;
         }

         return true;
      }